

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestPicker::testEvenDisabled(TestPicker *this)

{
  QPoint pos;
  undefined8 uVar1;
  Object *obj;
  long lVar2;
  char cVar3;
  undefined8 uVar4;
  QPoint pos_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_178;
  int iStack_174;
  QString local_168;
  double local_150;
  double local_148;
  StringListEvenDisabledModel model;
  int local_118;
  int iStack_114;
  double local_108;
  double dStack_100;
  undefined8 local_f8;
  QSignalSpy spy;
  QMouseEvent me;
  
  QStringListModel::QStringListModel(&model.super_QStringListModel,(QObject *)0x0);
  model._0_8_ = &PTR_metaObject_00199450;
  QStringListModel::setStringList((QList *)&model.super_QStringListModel);
  QtMWidgets::Picker::setModel((this->m_picker).value,(QAbstractItemModel *)&model);
  QtMWidgets::Picker::setCurrentIndex((this->m_picker).value,3);
  obj = (this->m_picker).value;
  lVar2 = *(long *)&obj->field_0x20;
  uVar4 = *(undefined8 *)(lVar2 + 0x1c);
  uVar1 = *(undefined8 *)(lVar2 + 0x14);
  QSignalSpy::QSignalSpy<void(QtMWidgets::Picker::*)(int)>(&spy,obj,0x156672);
  local_178 = (int)uVar4;
  iStack_174 = (int)((ulong)uVar4 >> 0x20);
  local_118 = (int)uVar1;
  iStack_114 = (int)((ulong)uVar1 >> 0x20);
  iVar7 = ((local_178 - local_118) + 1) / 2;
  iVar8 = ((iStack_174 - iStack_114) + 1) / 2;
  pos.yp = iVar8;
  pos.xp = iVar7;
  QTest::mouseEvent(MousePress,&((this->m_picker).value)->super_QWidget,LeftButton,
                    (KeyboardModifiers)0x0,pos,-1);
  iVar5 = (this->m_delta).xp + iVar7;
  iVar6 = (this->m_delta).yp + iVar8;
  local_f8 = CONCAT44(iVar6,iVar5);
  local_108 = (double)iVar5;
  dStack_100 = (double)iVar6;
  uVar4 = QWidget::mapToGlobal((QPoint *)(this->m_picker).value);
  local_150 = (double)(int)uVar4;
  local_148 = (double)(int)((ulong)uVar4 >> 0x20);
  local_168.d.d = (Data *)0x0;
  local_168.d.ptr = (char16_t *)0x0;
  local_168.d.size = 0;
  uVar4 = QPointingDevice::primaryPointingDevice(&local_168);
  QMouseEvent::QMouseEvent(&me,5,&local_108,&local_150,1,1,0,uVar4);
  if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,8);
    }
  }
  QCoreApplication::sendEvent((QObject *)(this->m_picker).value,(QEvent *)&me);
  QTest::qWait(500);
  pos_00.xp = iVar7 + (this->m_delta).xp;
  pos_00.yp = iVar8 + (this->m_delta).yp;
  QTest::mouseEvent(MouseRelease,&((this->m_picker).value)->super_QWidget,LeftButton,
                    (KeyboardModifiers)0x0,pos_00,0x14);
  QTest::mouseEvent(MouseClick,&((this->m_picker).value)->super_QWidget,LeftButton,
                    (KeyboardModifiers)0x0,pos,0x14);
  cVar3 = QTest::qVerify(spy.super_QList<QList<QVariant>_>.d.size == 0,"spy.count() == 0","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/picker/main.cpp"
                         ,0xce);
  if (cVar3 != '\0') {
    QtMWidgets::Picker::setModel((this->m_picker).value,(QAbstractItemModel *)&this->m_model);
  }
  QMouseEvent::~QMouseEvent(&me);
  spy._0_8_ = &PTR_metaObject_00199368;
  QObject::~QObject((QObject *)&spy.m_loop);
  if (spy.args.d.d != (Data *)0x0) {
    LOCK();
    ((spy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((spy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((spy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(spy.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (spy.sig.d.d != (Data *)0x0) {
    LOCK();
    ((spy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((spy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((spy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(spy.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer(&spy.super_QList<QList<QVariant>_>.d);
  QObject::~QObject(&spy.super_QObject);
  model._0_8_ = QColor::convertTo;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&model.field_0x10);
  QAbstractListModel::~QAbstractListModel((QAbstractListModel *)&model);
  return;
}

Assistant:

void testEvenDisabled()
	{
		StringListEvenDisabledModel model;
		model.setStringList( m_data );

		m_picker->setModel( &model );

		m_picker->setCurrentIndex( 3 );

		QPoint c( m_picker->width() / 2, m_picker->height() / 2 );

		QSignalSpy spy( m_picker.data(), QOverload< int >::of(
			&QtMWidgets::Picker::currentIndexChanged ) );

		QTest::mousePress( m_picker.data(), Qt::LeftButton, {}, c );
		QMouseEvent me( QEvent::MouseMove, c + m_delta, m_picker->mapToGlobal( c + m_delta ),
			Qt::LeftButton, Qt::LeftButton, {} );
		QApplication::sendEvent( m_picker.data(), &me );
		QTest::qWait( 500 );
		QTest::mouseRelease( m_picker.data(), Qt::LeftButton, {}, c + m_delta, 20 );
		QTest::mouseClick( m_picker.data(), Qt::LeftButton, {}, c, 20 );

		QVERIFY( spy.count() == 0 );

		m_picker->setModel( &m_model );
	}